

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMacroCommand.cxx
# Opt level: O1

bool __thiscall
cmMacroHelperCommand::InvokeInitialPass
          (cmMacroHelperCommand *this,
          vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *args,
          cmExecutionStatus *inStatus)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  byte bVar4;
  pointer pbVar5;
  long *plVar6;
  size_t sVar7;
  long lVar8;
  ulong *puVar9;
  cmExecutionStatus *pcVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  cmMacroHelperCommand *pcVar14;
  ulong uVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  pointer pcVar17;
  pointer pcVar18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expandedArgs;
  cmListFileFunction newLFF;
  cmExecutionStatus status;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  variables;
  MacroPushPop macroScope;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  argVs;
  string expandedArgv;
  string expandedArgn;
  string argcDef;
  char argvName [60];
  ostringstream argcDefStream;
  byte local_379;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_378;
  cmMacroHelperCommand *local_358;
  cmListFileFunction local_350;
  string local_310;
  value_type local_2f0;
  cmExecutionStatus *local_2c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2b8;
  cmExecutionStatus *local_298;
  cmExecutionStatus *local_290;
  pointer local_288;
  ulong local_280;
  MacroPushPop local_278;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_268;
  string local_248;
  string local_228;
  string local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8 [2];
  string local_1a8 [3];
  ios_base local_138 [264];
  
  local_378.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_378.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_378.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2c0 = inStatus;
  cmMakefile::ExpandArguments((this->super_cmCommand).Makefile,args,&local_378,(char *)0x0);
  if ((ulong)((long)local_378.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_378.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5) <
      ((long)(this->Args).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(this->Args).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 5) - 1U) {
    local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"Macro invoked with incorrect arguments for macro named: ","");
    std::__cxx11::string::_M_append
              ((char *)local_1a8,
               (ulong)(((this->Args).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
    cmCommand::SetError(&this->super_cmCommand,local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
    }
    bVar4 = 0;
  }
  else {
    cmMakefile::MacroPushPop::MacroPushPop
              (&local_278,(this->super_cmCommand).Makefile,&this->FilePath,&this->Policies);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__cxx11::stringbuf::str();
    local_350.super_cmCommandContext.Name._M_dataplus._M_p =
         (pointer)((long)local_378.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start +
                  (long)(this->Args).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish +
                  (-0x20 - (long)(this->Args).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start));
    local_350.super_cmCommandContext.Name._M_string_length =
         (size_type)
         local_378.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              (&local_228,
               (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)&local_350,";");
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_248,&local_378,";");
    local_2b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(&local_2b8,
              ((long)(this->Args).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->Args).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5) - 1);
    pbVar5 = (this->Args).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_358 = this;
    if (0x20 < (ulong)((long)(this->Args).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar5)) {
      uVar11 = 1;
      uVar12 = 2;
      do {
        std::operator+(local_1e8,"${",pbVar5 + uVar11);
        plVar6 = (long *)std::__cxx11::string::append((char *)local_1e8);
        local_350.super_cmCommandContext.Name._M_dataplus._M_p =
             (pointer)&local_350.super_cmCommandContext.Name.field_2;
        puVar9 = (ulong *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar9) {
          local_350.super_cmCommandContext.Name.field_2._M_allocated_capacity = *puVar9;
          local_350.super_cmCommandContext.Name.field_2._8_8_ = plVar6[3];
        }
        else {
          local_350.super_cmCommandContext.Name.field_2._M_allocated_capacity = *puVar9;
          local_350.super_cmCommandContext.Name._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_350.super_cmCommandContext.Name._M_string_length = plVar6[1];
        *plVar6 = (long)puVar9;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_350);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_350.super_cmCommandContext.Name._M_dataplus._M_p !=
            &local_350.super_cmCommandContext.Name.field_2) {
          operator_delete(local_350.super_cmCommandContext.Name._M_dataplus._M_p,
                          local_350.super_cmCommandContext.Name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8[0]._M_dataplus._M_p != &local_1e8[0].field_2) {
          operator_delete(local_1e8[0]._M_dataplus._M_p,
                          local_1e8[0].field_2._M_allocated_capacity + 1);
        }
        pbVar5 = (local_358->Args).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        bVar3 = uVar12 < (ulong)((long)(local_358->Args).
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar5 >>
                                5);
        uVar11 = uVar12;
        uVar12 = (ulong)((int)uVar12 + 1);
      } while (bVar3);
    }
    local_268.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_268.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_268.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(&local_268,
              (long)local_378.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_378.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5);
    paVar16 = &local_350.super_cmCommandContext.Name.field_2;
    if (local_378.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_378.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar11 = 0;
      do {
        sprintf((char *)local_1e8,"${ARGV%i}",uVar11);
        local_350.super_cmCommandContext.Name._M_dataplus._M_p = (pointer)paVar16;
        sVar7 = strlen((char *)local_1e8);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_350,local_1e8,(long)&local_1e8[0]._M_dataplus._M_p + sVar7);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_268,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_350);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_350.super_cmCommandContext.Name._M_dataplus._M_p != paVar16) {
          operator_delete(local_350.super_cmCommandContext.Name._M_dataplus._M_p,
                          local_350.super_cmCommandContext.Name.field_2._M_allocated_capacity + 1);
        }
        uVar11 = (ulong)((int)uVar11 + 1);
      } while (uVar11 < (ulong)((long)local_378.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_378.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    local_350.super_cmCommandContext.Name._M_string_length = 0;
    local_350.super_cmCommandContext.Name.field_2._M_allocated_capacity =
         local_350.super_cmCommandContext.Name.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_350.super_cmCommandContext.Line = 0;
    local_350.Arguments.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_350.Arguments.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_350.Arguments.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar4 = 1;
    local_350.super_cmCommandContext.Name._M_dataplus._M_p = (pointer)paVar16;
    if ((local_358->Functions).
        super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (local_358->Functions).
        super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
        super__Vector_impl_data._M_start) {
      paVar1 = &local_310.field_2;
      local_298 = (cmExecutionStatus *)&local_2c0->BreakInvoked;
      local_290 = (cmExecutionStatus *)&local_2c0->NestedError;
      uVar11 = 0;
      do {
        pcVar18 = local_350.Arguments.
                  super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        local_280 = uVar11;
        if (local_350.Arguments.
            super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_350.Arguments.
            super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
            super__Vector_impl_data._M_start) {
          local_288 = local_350.Arguments.
                      super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          paVar16 = &((local_350.Arguments.
                       super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
                       _M_impl.super__Vector_impl_data._M_start)->Value).field_2;
          do {
            if (paVar16 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(&paVar16->_M_allocated_capacity)[-2]) {
              operator_delete((long *)(&paVar16->_M_allocated_capacity)[-2],
                              paVar16->_M_allocated_capacity + 1);
            }
            pcVar17 = (pointer)(&paVar16->_M_allocated_capacity + 4);
            paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(&paVar16->_M_allocated_capacity + 6);
          } while (pcVar17 != pcVar18);
          local_350.Arguments.
          super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
          super__Vector_impl_data._M_finish = local_288;
        }
        pcVar14 = local_358;
        pcVar2 = (local_358->Functions).
                 super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl
                 .super__Vector_impl_data._M_start;
        std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::reserve
                  (&local_350.Arguments,
                   ((long)*(pointer *)
                           ((long)&pcVar2[uVar11].Arguments.
                                   super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                                   ._M_impl + 8) -
                    *(long *)&pcVar2[uVar11].Arguments.
                              super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                              ._M_impl >> 4) * -0x5555555555555555);
        std::__cxx11::string::_M_assign((string *)&local_350);
        pcVar2 = (pcVar14->Functions).
                 super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl
                 .super__Vector_impl_data._M_start;
        local_350.super_cmCommandContext.Line = pcVar2[uVar11].super_cmCommandContext.Line;
        for (pcVar18 = *(pointer *)
                        &pcVar2[uVar11].Arguments.
                         super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                         ._M_impl;
            pcVar18 !=
            *(pointer *)
             ((long)&(pcVar14->Functions).
                     super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar11].Arguments.
                     super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
                     _M_impl + 8); pcVar18 = pcVar18 + 1) {
          local_2f0.Value._M_dataplus._M_p = (pointer)&local_2f0.Value.field_2;
          local_2f0.Value._M_string_length = 0;
          local_2f0.Value.field_2._M_local_buf[0] = '\0';
          local_2f0.Delim = Unquoted;
          local_2f0.Line = 0;
          std::__cxx11::string::_M_assign((string *)&local_2f0);
          if (pcVar18->Delim != Bracket) {
            if (local_2b8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                local_2b8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              uVar12 = 0;
              uVar15 = 1;
              do {
                cmsys::SystemTools::ReplaceString
                          (&local_2f0.Value,
                           local_2b8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar12,
                           local_378.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar12);
                bVar3 = uVar15 < (ulong)((long)local_2b8.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)local_2b8.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start >> 5);
                uVar12 = uVar15;
                uVar15 = (ulong)((int)uVar15 + 1);
              } while (bVar3);
            }
            local_310._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"${ARGC}","");
            cmsys::SystemTools::ReplaceString(&local_2f0.Value,&local_310,&local_208);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_310._M_dataplus._M_p != paVar1) {
              operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1
                             );
            }
            local_310._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"${ARGN}","");
            cmsys::SystemTools::ReplaceString(&local_2f0.Value,&local_310,&local_228);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_310._M_dataplus._M_p != paVar1) {
              operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1
                             );
            }
            local_310._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"${ARGV}","");
            cmsys::SystemTools::ReplaceString(&local_2f0.Value,&local_310,&local_248);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_310._M_dataplus._M_p != paVar1) {
              operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1
                             );
            }
            lVar8 = std::__cxx11::string::find((char *)&local_2f0,0x4db292,0);
            if ((lVar8 != -1) &&
               (local_378.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                local_378.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)) {
              uVar13 = 1;
              uVar12 = 0;
              do {
                cmsys::SystemTools::ReplaceString
                          (&local_2f0.Value,
                           local_268.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar12,
                           local_378.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar12);
                uVar12 = (ulong)uVar13;
                uVar13 = uVar13 + 1;
              } while (uVar12 < (ulong)((long)local_378.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)local_378.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start >> 5));
            }
          }
          local_2f0.Delim = pcVar18->Delim;
          local_2f0.Line = pcVar18->Line;
          std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::push_back
                    (&local_350.Arguments,&local_2f0);
          pcVar14 = local_358;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f0.Value._M_dataplus._M_p != &local_2f0.Value.field_2) {
            operator_delete(local_2f0.Value._M_dataplus._M_p,
                            CONCAT71(local_2f0.Value.field_2._M_allocated_capacity._1_7_,
                                     local_2f0.Value.field_2._M_local_buf[0]) + 1);
          }
        }
        local_2f0.Value._M_dataplus._M_p = local_2f0.Value._M_dataplus._M_p & 0xffffffff00000000;
        bVar3 = cmMakefile::ExecuteCommand
                          ((pcVar14->super_cmCommand).Makefile,&local_350,
                           (cmExecutionStatus *)&local_2f0);
        if ((bVar3) && (local_2f0.Value._M_dataplus._M_p._3_1_ != '\x01')) {
          bVar4 = 1;
          pcVar10 = local_2c0;
          if ((char)local_2f0.Value._M_dataplus._M_p != '\0') goto LAB_00306899;
          bVar4 = 1;
          bVar3 = true;
          pcVar10 = local_298;
          if (local_2f0.Value._M_dataplus._M_p._1_1_ == '\x01') goto LAB_00306899;
        }
        else {
          local_278.ReportError = false;
          bVar4 = 0;
          pcVar10 = local_290;
LAB_00306899:
          pcVar10->ReturnInvoked = true;
          bVar3 = false;
          local_379 = bVar4;
        }
        bVar4 = local_379;
        if (!bVar3) goto LAB_00306901;
        uVar11 = (ulong)((int)local_280 + 1);
      } while (uVar11 < (ulong)((long)(pcVar14->Functions).
                                      super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(pcVar14->Functions).
                                      super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 6));
      bVar4 = 1;
    }
LAB_00306901:
    std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector
              (&local_350.Arguments);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350.super_cmCommandContext.Name._M_dataplus._M_p !=
        &local_350.super_cmCommandContext.Name.field_2) {
      operator_delete(local_350.super_cmCommandContext.Name._M_dataplus._M_p,
                      local_350.super_cmCommandContext.Name.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_268);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_2b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    cmMakefile::MacroPushPop::~MacroPushPop(&local_278);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_378);
  return (bool)(bVar4 & 1);
}

Assistant:

bool cmMacroHelperCommand::InvokeInitialPass
(const std::vector<cmListFileArgument>& args,
 cmExecutionStatus &inStatus)
{
  // Expand the argument list to the macro.
  std::vector<std::string> expandedArgs;
  this->Makefile->ExpandArguments(args, expandedArgs);

  // make sure the number of arguments passed is at least the number
  // required by the signature
  if (expandedArgs.size() < this->Args.size() - 1)
    {
    std::string errorMsg =
      "Macro invoked with incorrect arguments for macro named: ";
    errorMsg += this->Args[0];
    this->SetError(errorMsg);
    return false;
    }

  cmMakefile::MacroPushPop macroScope(this->Makefile,
                                      this->FilePath,
                                      this->Policies);

  // set the value of argc
  std::ostringstream argcDefStream;
  argcDefStream << expandedArgs.size();
  std::string argcDef = argcDefStream.str();

  std::vector<std::string>::const_iterator eit
      = expandedArgs.begin() + (this->Args.size() - 1);
  std::string expandedArgn = cmJoin(cmMakeRange(eit, expandedArgs.end()), ";");
  std::string expandedArgv = cmJoin(expandedArgs, ";");
  std::vector<std::string> variables;
  variables.reserve(this->Args.size() - 1);
  for (unsigned int j = 1; j < this->Args.size(); ++j)
    {
    variables.push_back("${" + this->Args[j] + "}");
    }
  std::vector<std::string> argVs;
  argVs.reserve(expandedArgs.size());
  char argvName[60];
  for (unsigned int j = 0; j < expandedArgs.size(); ++j)
    {
    sprintf(argvName,"${ARGV%i}",j);
    argVs.push_back(argvName);
    }
  // Invoke all the functions that were collected in the block.
  cmListFileFunction newLFF;
  // for each function
  for(unsigned int c = 0; c < this->Functions.size(); ++c)
    {
    // Replace the formal arguments and then invoke the command.
    newLFF.Arguments.clear();
    newLFF.Arguments.reserve(this->Functions[c].Arguments.size());
    newLFF.Name = this->Functions[c].Name;
    newLFF.Line = this->Functions[c].Line;

    // for each argument of the current function
    for (std::vector<cmListFileArgument>::iterator k =
           this->Functions[c].Arguments.begin();
         k != this->Functions[c].Arguments.end(); ++k)
      {
      cmListFileArgument arg;
      arg.Value = k->Value;
      if(k->Delim != cmListFileArgument::Bracket)
        {
        // replace formal arguments
        for (unsigned int j = 0; j < variables.size(); ++j)
          {
          cmSystemTools::ReplaceString(arg.Value, variables[j],
                                       expandedArgs[j]);
          }
        // replace argc
        cmSystemTools::ReplaceString(arg.Value, "${ARGC}", argcDef);

        cmSystemTools::ReplaceString(arg.Value, "${ARGN}", expandedArgn);
        cmSystemTools::ReplaceString(arg.Value, "${ARGV}", expandedArgv);

        // if the current argument of the current function has ${ARGV in it
        // then try replacing ARGV values
        if (arg.Value.find("${ARGV") != std::string::npos)
          {
          for (unsigned int t = 0; t < expandedArgs.size(); ++t)
            {
            cmSystemTools::ReplaceString(arg.Value, argVs[t],
                                         expandedArgs[t]);
            }
          }
        }
      arg.Delim = k->Delim;
      arg.Line = k->Line;
      newLFF.Arguments.push_back(arg);
      }
    cmExecutionStatus status;
    if(!this->Makefile->ExecuteCommand(newLFF, status) ||
       status.GetNestedError())
      {
      // The error message should have already included the call stack
      // so we do not need to report an error here.
      macroScope.Quiet();
      inStatus.SetNestedError(true);
      return false;
      }
    if (status.GetReturnInvoked())
      {
      inStatus.SetReturnInvoked(true);
      return true;
      }
    if (status.GetBreakInvoked())
      {
      inStatus.SetBreakInvoked(true);
      return true;
      }
    }
  return true;
}